

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O3

string * deqp::gles31::Functional::anon_unknown_1::generateTessControlShader
                   (string *__return_storage_ptr__,ShaderType shaderType,
                   string *shaderUniformDeclarations,string *shaderBody)

{
  ostream *poVar1;
  string *psVar2;
  string *extraout_RAX;
  char *pcVar3;
  char *pcVar4;
  ostringstream tessControlShaderSource;
  ostringstream aoStack_198 [112];
  ios_base local_128 [264];
  
  if (shaderType < SHADERTYPE_LAST) {
    if ((0xbU >> (shaderType & 0x1f) & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream(aoStack_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)aoStack_198,"#version 310 es\n",0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)aoStack_198,"#extension GL_EXT_tessellation_shader : require\n",0x30);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)aoStack_198,"layout (vertices=3) out;\n",0x19);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_198,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)aoStack_198,"uniform highp int u_arrayNdx;\n\n",0x1f);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)aoStack_198,(shaderUniformDeclarations->_M_dataplus)._M_p,
                          shaderUniformDeclarations->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"void main (void)\n",0x11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"{\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\thighp vec4 color;\n\n",0x14);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,(shaderBody->_M_dataplus)._M_p,shaderBody->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,
                 "\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n",
                 0x4b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"}\n",2);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(aoStack_198);
      psVar2 = (string *)std::ios_base::~ios_base(local_128);
      return psVar2;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = 
    "#version 310 es\n#extension GL_EXT_tessellation_shader : require\nlayout (vertices=3) out;\n\nvoid main (void)\n{\n\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n}\n"
    ;
    pcVar3 = "";
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "";
    pcVar4 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar4,pcVar3);
  return extraout_RAX;
}

Assistant:

std::string generateTessControlShader (ShaderType shaderType, const std::string& shaderUniformDeclarations, const std::string& shaderBody)
{
	static const char* const s_simpleTessContorlShaderSource =	"#version 310 es\n"
																"#extension GL_EXT_tessellation_shader : require\n"
																"layout (vertices=3) out;\n"
																"\n"
																"void main (void)\n"
																"{\n"
																"	gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
																"}\n";

	switch (shaderType)
	{
		case SHADERTYPE_VERTEX:
		case SHADERTYPE_FRAGMENT:
		case SHADERTYPE_TESS_EVALUATION:
			return s_simpleTessContorlShaderSource;

		case SHADERTYPE_TESS_CONTROL:
		case SHADERTYPE_ALL:
		{
			std::ostringstream tessControlShaderSource;
			tessControlShaderSource <<	"#version 310 es\n"
									<<	"#extension GL_EXT_tessellation_shader : require\n"
									<<	"layout (vertices=3) out;\n"
									<<	"\n"
									<<	"uniform highp int u_arrayNdx;\n\n"
									<<	shaderUniformDeclarations << "\n"
									<<	"void main (void)\n"
									<<	"{\n"
									<<	"	highp vec4 color;\n\n"
									<<	shaderBody << "\n"
									<<	"	gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
									<<	"}\n";

			return tessControlShaderSource.str();
		}

		default:
			DE_ASSERT(false);
			return "";
	}
}